

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2notes.cpp
# Opt level: O0

void convertMidiFile(MidiFile *midifile,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *matlab)

{
  allocator<double> *this;
  value_type vVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  reference pvVar8;
  reference pvVar9;
  ostream *poVar10;
  void *pvVar11;
  MidiEventList *pMVar12;
  MidiEvent *pMVar13;
  byte *pbVar14;
  size_type __n;
  reference pvVar15;
  uint *puVar16;
  double dVar17;
  int channel;
  int command;
  int vel;
  int key;
  double offtime;
  int i;
  vector<int,_std::allocator<int>_> onvelocities;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> ontimes;
  allocator<double> local_31;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> event;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *matlab_local;
  MidiFile *midifile_local;
  
  event.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)matlab;
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,8,&local_31);
  std::allocator<double>::~allocator(&local_31);
  this = (allocator<double> *)
         ((long)&onvelocities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,0x80,this);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&onvelocities.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<int>::allocator((allocator<int> *)((long)&offtime + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,0x80,(allocator<int> *)((long)&offtime + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&offtime + 7));
  for (offtime._0_4_ = 0; offtime._0_4_ < 0x80; offtime._0_4_ = offtime._0_4_ + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,(long)offtime._0_4_);
    *pvVar8 = -1.0;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&i,(long)offtime._0_4_);
    *pvVar9 = -1;
  }
  if (verboseQ != 0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"-1\ttpq\t");
    iVar5 = smf::MidiFile::getTicksPerQuarterNote(midifile);
    pvVar11 = (void *)std::ostream::operator<<(poVar10,iVar5);
    std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
  }
  offtime._0_4_ = 0;
  do {
    iVar5 = offtime._0_4_;
    iVar6 = smf::MidiFile::getNumEvents(midifile,0);
    if (iVar6 <= iVar5) {
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_60);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_30);
      return;
    }
    if (verboseQ != 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,">>> ");
      pMVar12 = smf::MidiFile::operator[](midifile,0);
      pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
      pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)*pbVar14);
      std::operator<<(poVar10,"\n");
    }
    __n = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_30);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)local_30,__n,&unused);
    pMVar12 = smf::MidiFile::operator[](midifile,0);
    pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
    pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0);
    bVar4 = *pbVar14 & 0xf0;
    pMVar12 = smf::MidiFile::operator[](midifile,0);
    pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
    pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0);
    bVar3 = *pbVar14;
    pMVar12 = smf::MidiFile::operator[](midifile,0);
    pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0);
    if (*pvVar15 == 0xff) {
      pMVar12 = smf::MidiFile::operator[](midifile,0);
      pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1);
      if ((*pvVar15 == 'Q') && (setTempo(midifile,offtime._0_4_,&tempo), verboseQ != 0)) {
        poVar10 = std::operator<<((ostream *)&std::cout,"# New Tempo: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,tempo);
        std::operator<<(poVar10,"\n");
      }
    }
    pMVar12 = smf::MidiFile::operator[](midifile,0);
    pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
    pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0);
    if ((*pbVar14 & 0xf) != 9) {
      if (bVar4 == 0xf0) {
        pMVar12 = smf::MidiFile::operator[](midifile,0);
        pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
        pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0);
        bVar4 = *pbVar14;
      }
      if (bVar4 == 0x90) {
        pMVar12 = smf::MidiFile::operator[](midifile,0);
        pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
        pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,2);
        if (*pvVar15 == '\0') goto LAB_0012cfac;
        pMVar12 = smf::MidiFile::operator[](midifile,0);
        pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
        pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1);
        bVar3 = *pbVar14;
        pMVar12 = smf::MidiFile::operator[](midifile,0);
        pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
        pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,2);
        bVar4 = *pbVar14;
        pMVar12 = smf::MidiFile::operator[](midifile,0);
        pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
        dVar17 = tempo;
        iVar5 = pMVar13->tick;
        iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
        dVar17 = getTime(iVar5,dVar17,iVar6);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_60,
                            (long)(int)(uint)bVar3);
        *pvVar8 = dVar17;
        puVar16 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)&i,(long)(int)(uint)bVar3)
        ;
        *puVar16 = (uint)bVar4;
      }
      else {
LAB_0012cfac:
        if ((bVar4 == 0x90) || (bVar4 == 0x80)) {
          pMVar12 = smf::MidiFile::operator[](midifile,0);
          pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
          pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1);
          uVar7 = (uint)*pbVar14;
          pMVar12 = smf::MidiFile::operator[](midifile,0);
          pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
          dVar17 = tempo;
          iVar5 = pMVar13->tick;
          iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
          dVar17 = getTime(iVar5,dVar17,iVar6);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&legend_opcode,1);
          *pvVar9 = 1;
          if (verboseQ == 0) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_60,(long)(int)uVar7
                               );
            vVar1 = *pvVar8;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,0);
            *pvVar8 = vVar1;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,1);
            *pvVar8 = 1000.0;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_60,(long)(int)uVar7
                               );
            dVar2 = *pvVar8;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,2);
            *pvVar8 = dVar17 - dVar2;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,3);
            *pvVar8 = (double)uVar7;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&i,(long)(int)uVar7);
            iVar5 = *pvVar9;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,4);
            *pvVar8 = (double)iVar5;
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0)
            ;
            bVar4 = *pbVar14;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,5);
            *pvVar8 = (double)(bVar4 & 0xf);
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            iVar5 = pMVar13->track;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,6);
            *pvVar8 = (double)iVar5;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,7);
            *pvVar8 = (double)(bVar3 & 0xf);
          }
          else {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_60,(long)(int)uVar7
                               );
            poVar10 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar8);
            poVar10 = std::operator<<(poVar10,"\tnote");
            poVar10 = std::operator<<(poVar10,"\tdur=");
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_60,(long)(int)uVar7
                               );
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar17 - *pvVar8);
            poVar10 = std::operator<<(poVar10,"\tpch=");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,uVar7);
            poVar10 = std::operator<<(poVar10,"\tvel=");
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)&i,(long)(int)uVar7);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar9);
            poVar10 = std::operator<<(poVar10,"\tch=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pbVar14 & 0xf);
            poVar10 = std::operator<<(poVar10,"\ttrack=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pvVar11 = (void *)std::ostream::operator<<(poVar10,pMVar13->track);
            std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          }
        }
        else if (bVar4 == 0xb0) {
          pMVar12 = smf::MidiFile::operator[](midifile,0);
          pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
          pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&legend_controller,(ulong)*pbVar14);
          *pvVar9 = 1;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&legend_opcode,2);
          *pvVar9 = 1;
          if (verboseQ == 0) {
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            dVar17 = tempo;
            iVar5 = pMVar13->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar17 = getTime(iVar5,dVar17,iVar6);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,0);
            *pvVar8 = dVar17;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,1);
            *pvVar8 = 2000.0;
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1)
            ;
            bVar3 = *pbVar14;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,2);
            *pvVar8 = (double)bVar3;
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,2)
            ;
            bVar3 = *pbVar14;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,3);
            *pvVar8 = (double)bVar3;
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0)
            ;
            bVar3 = *pbVar14;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,5);
            *pvVar8 = (double)(bVar3 & 0xf);
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            iVar5 = pMVar13->track;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,6);
            *pvVar8 = (double)iVar5;
          }
          else {
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            dVar17 = tempo;
            iVar5 = pMVar13->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar17 = getTime(iVar5,dVar17,iVar6);
            poVar10 = (ostream *)std::ostream::operator<<(&std::cout,dVar17);
            poVar10 = std::operator<<(poVar10,"\tcontrol");
            poVar10 = std::operator<<(poVar10,"\ttype=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)*pbVar14);
            poVar10 = std::operator<<(poVar10,"\tval=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,2)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)*pbVar14);
            poVar10 = std::operator<<(poVar10,"\tch=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pbVar14 & 0xf);
            poVar10 = std::operator<<(poVar10,"\ttrack=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,pMVar13->track);
            std::operator<<(poVar10,"\n");
          }
        }
        else if (bVar4 == 0xc0) {
          pMVar12 = smf::MidiFile::operator[](midifile,0);
          pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
          pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1);
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&legend_instr,(ulong)*pbVar14)
          ;
          *pvVar9 = 1;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&legend_opcode,3);
          *pvVar9 = 1;
          if (verboseQ == 0) {
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            dVar17 = tempo;
            iVar5 = pMVar13->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar17 = getTime(iVar5,dVar17,iVar6);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,0);
            *pvVar8 = dVar17;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,1);
            *pvVar8 = 3000.0;
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1)
            ;
            bVar3 = *pbVar14;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,2);
            *pvVar8 = (double)bVar3;
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0)
            ;
            bVar3 = *pbVar14;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,5);
            *pvVar8 = (double)(bVar3 & 0xf);
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            iVar5 = pMVar13->track;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,6);
            *pvVar8 = (double)iVar5;
          }
          else {
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            dVar17 = tempo;
            iVar5 = pMVar13->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar17 = getTime(iVar5,dVar17,iVar6);
            poVar10 = (ostream *)std::ostream::operator<<(&std::cout,dVar17);
            poVar10 = std::operator<<(poVar10,"\tinstr");
            poVar10 = std::operator<<(poVar10,"\tname=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1)
            ;
            poVar10 = std::operator<<(poVar10,GMinstrument[*pbVar14]);
            poVar10 = std::operator<<(poVar10,"\tnum=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,1)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,(uint)*pbVar14);
            poVar10 = std::operator<<(poVar10,"\tch=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            pbVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pMVar13,0)
            ;
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pbVar14 & 0xf);
            poVar10 = std::operator<<(poVar10,"\ttrack=");
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,pMVar13->track);
            std::operator<<(poVar10,"\n");
          }
        }
        else if (bVar4 == 0xff) {
          if (verboseQ == 0) {
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            dVar17 = tempo;
            iVar5 = pMVar13->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar17 = getTime(iVar5,dVar17,iVar6);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_30,0);
            *pvVar8 = dVar17;
          }
          else {
            pMVar12 = smf::MidiFile::operator[](midifile,0);
            pMVar13 = smf::MidiEventList::operator[](pMVar12,offtime._0_4_);
            dVar17 = tempo;
            iVar5 = pMVar13->tick;
            iVar6 = smf::MidiFile::getTicksPerQuarterNote(midifile);
            dVar17 = getTime(iVar5,dVar17,iVar6);
            poVar10 = (ostream *)std::ostream::operator<<(&std::cout,dVar17);
            std::operator<<(poVar10,"\t");
          }
          processMetaEvent(midifile,offtime._0_4_,
                           (vector<double,_std::allocator<double>_> *)local_30);
          if (verboseQ != 0) {
            std::operator<<((ostream *)&std::cout,"\n");
          }
        }
      }
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_30,1);
      if ((*pvVar8 != unused) || (NAN(*pvVar8) || NAN(unused))) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)event.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(value_type *)local_30);
      }
    }
    offtime._0_4_ = offtime._0_4_ + 1;
  } while( true );
}

Assistant:

void convertMidiFile(MidiFile& midifile, vector<vector<double> >& matlab) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   vector<double> event(8);
   vector<double> ontimes(128);
   vector<int> onvelocities(128);
   int i;
   for (i=0; i<128; i++) {
      ontimes[i] = -1.0;
      onvelocities[i] = -1;
   }

   if (verboseQ) {
      cout << "-1\ttpq\t" << midifile.getTicksPerQuarterNote() << endl;
   }

   double offtime = 0.0;
   int key = 0;
   int vel = 0;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      if (verboseQ) {
         cout << ">>> " << (int)midifile[0][i][0] << "\n";
      }
      event.assign(event.size(), unused);
      int command = midifile[0][i][0] & 0xf0;
      int channel = midifile[0][i][0] & 0x0f;

      // check for tempo indication
      if (midifile[0][i][0] == 0xff &&
                 midifile[0][i][1] == 0x51) {
         setTempo(midifile, i, tempo);
         if (verboseQ) {
            cout << "# New Tempo: " << tempo << "\n";
         }
      }

      if ((midifile[0][i][0] & 0x0f) == 0x09) {
          continue;
      }
      if (command == 0xf0) {
         command = midifile[0][i][0];
      }
      if (command == 0x90 && midifile[0][i][2] != 0) {
         // store note-on velocity and time
         key = midifile[0][i][1];
         vel = midifile[0][i][2];
         ontimes[key] = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());

         onvelocities[key] = vel;
      } else if (command == 0x90 || command == 0x80) {
         // note off command write to output
         key = midifile[0][i][1];
         offtime = getTime(midifile[0][i].tick, tempo,
            midifile.getTicksPerQuarterNote());
         legend_opcode[OP_NOTE/1000] = 1;

         if (verboseQ) {
            cout
              << ontimes[key]
              << "\tnote"
              << "\tdur=" << offtime - ontimes[key]
              << "\tpch=" << key
              << "\tvel=" << onvelocities[key]
              << "\tch="  << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << endl;
         } else {
            event[0] = ontimes[key];
            event[1] = OP_NOTE;
            event[2] = offtime - ontimes[key];
            event[3] = key;
            event[4] = onvelocities[key];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
            event[7] = channel;
         }
      } else if (command == 0xb0) {
         legend_controller[midifile[0][i][1]] = 1;
         legend_opcode[OP_CONTROL/1000] = 1;

         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\tcontrol"
                 << "\ttype="  << (int)midifile[0][i][1]
                 << "\tval="   << (int)midifile[0][i][2]
                 << "\tch="    << (midifile[0][i][0] & 0x0f)
                 << "\ttrack=" << midifile[0][i].track
                 << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                          midifile.getTicksPerQuarterNote());
            event[1] = OP_CONTROL;
            event[2] = (int)midifile[0][i][1];
            event[3] = (int)midifile[0][i][2];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xc0) {
         legend_instr[midifile[0][i][1]] = 1;
         legend_opcode[OP_INSTR/1000] = 1;

         if (verboseQ) {
         cout << getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote())
              << "\tinstr"
              << "\tname="  << GMinstrument[midifile[0][i][1]]
              << "\tnum="   << (int)midifile[0][i][1]
              << "\tch="    << (midifile[0][i][0] & 0x0f)
              << "\ttrack=" << midifile[0][i].track
              << "\n";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                    midifile.getTicksPerQuarterNote());
            event[1] = OP_INSTR;
            event[2] = (int)midifile[0][i][1];
            event[5] = (midifile[0][i][0] & 0x0f);
            event[6] = midifile[0][i].track;
         }
      } else if (command == 0xff) {
         if (verboseQ) {
            cout << getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote())
                 << "\t";
         } else {
            event[0] = getTime(midifile[0][i].tick, tempo,
                       midifile.getTicksPerQuarterNote());
         }
         processMetaEvent(midifile, i, event);
         if (verboseQ) {
            cout << "\n";
         }
      }

      if (event[1] != unused) {
         matlab.push_back(event);
      }
   }
}